

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields
          (MessageGenerator *this,Printer *p)

{
  undefined1 auVar1 [8];
  bool bVar2;
  long *plVar3;
  long lVar4;
  const_iterator end;
  const_iterator begin;
  anon_class_16_2_a9d32e29 emit_pending_copy_fields;
  FieldDescriptor *first;
  int has_bit_word_index;
  anon_class_32_4_40eba909 emit_copy_message;
  anon_class_16_2_fd512ddd has_message;
  anon_class_24_3_e47482a1 load_has_bits;
  long alStack_2a0 [3];
  anon_class_1_0_00000001 local_281;
  undefined1 local_280 [8];
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  undefined8 uStack_260;
  long *local_258 [2];
  long local_248 [2];
  long *local_238;
  undefined1 local_230 [24];
  pointer local_218;
  pointer local_210;
  undefined8 *local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  char acStack_1f0 [4];
  undefined4 local_1ec;
  long *local_1e8;
  undefined8 local_1e0;
  long local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [24];
  code *local_1b0;
  byte local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined1 local_180;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_178;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  undefined8 uStack_118;
  undefined8 *local_110;
  undefined8 uStack_108;
  code *local_100;
  code *local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8;
  undefined1 local_80;
  MessageGenerator **local_78;
  undefined1 *local_70;
  MessageGenerator **local_68;
  MessageGenerator *local_60;
  MessageGenerator *local_58;
  undefined1 *local_50;
  MessageGenerator *local_48;
  undefined4 *local_40;
  undefined1 *local_38;
  
  local_210 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_218 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8 = 0;
  local_40 = &local_1ec;
  local_1ec = 0xffffffff;
  local_78 = &local_48;
  local_68 = &local_58;
  local_280 = (undefined1  [8])p;
  local_208 = &local_1f8;
  local_200 = local_280;
  local_70 = local_280;
  local_60 = this;
  local_58 = this;
  local_50 = local_280;
  local_48 = this;
  local_38 = local_280;
  if (0 < this->descriptor_->extension_range_count_) {
    alStack_2a0[2] = 0xde8a5e;
    io::Printer::Emit(p,0,0,0x4a,
                      "\n      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);\n    "
                     );
  }
  auVar1 = local_280;
  alStack_2a0[2] = 0xde8a84;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"copy_fields","");
  local_1e8 = &local_1d8;
  if (local_258[0] == local_248) {
    uStack_1d0 = local_248[1];
  }
  else {
    local_1e8 = local_258[0];
  }
  local_1e0 = local_258[1];
  local_258[1] = (long *)0x0;
  local_248[0]._0_1_ = 0;
  alStack_2a0[2] = 0xde8ae2;
  local_258[0] = local_248;
  local_1c8._0_8_ = operator_new(0x40);
  *(pointer **)local_1c8._0_8_ = &local_210;
  *(pointer **)(local_1c8._0_8_ + 8) = &local_218;
  *(MessageGenerator **)(local_1c8._0_8_ + 0x10) = this;
  *(undefined1 **)(local_1c8._0_8_ + 0x18) = local_280;
  *(undefined8 ***)(local_1c8._0_8_ + 0x20) = &local_208;
  *(MessageGenerator ****)(local_1c8._0_8_ + 0x28) = &local_78;
  *(undefined8 **)(local_1c8._0_8_ + 0x30) = &local_1f8;
  *(undefined1 *)(local_1c8._0_8_ + 0x38) = 0;
  local_1b0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_1a8 = '\x01';
  local_1a0 = &local_190;
  local_198 = 0;
  local_190 = 0;
  local_180 = 0;
  alStack_2a0[2] = 0xde8b84;
  std::__cxx11::string::_M_replace((ulong)&local_1a0,0,(char *)0x0,0x1258832);
  local_178._M_engaged = false;
  alStack_2a0[2] = 0xde8bb3;
  local_278 = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"copy_oneof_fields","");
  local_130 = local_120;
  if (local_278 == &local_268) {
    uStack_118 = uStack_260;
  }
  else {
    local_130 = local_278;
  }
  local_128 = local_270;
  local_270 = 0;
  local_268 = 0;
  alStack_2a0[2] = 0xde8c12;
  local_278 = &local_268;
  local_110 = (undefined8 *)operator_new(0x18);
  *local_110 = this;
  local_110[1] = local_280;
  *(undefined1 *)(local_110 + 2) = 0;
  local_f8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  uStack_108 = 0;
  local_100 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_f0 = 1;
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  local_c8 = 0;
  alStack_2a0[2] = 0xde8c93;
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)0x0,0x1258832);
  local_80 = 0;
  alStack_2a0[2] = 0xde8cbb;
  io::Printer::Emit((Printer *)auVar1,&local_1e8,2,0x47,
                    "\n            $copy_fields$;\n            $copy_oneof_fields$;\n          ");
  lVar4 = 0x170;
  do {
    if (acStack_1f0[lVar4] == '\x01') {
      alStack_2a0[2] = 0xde8ce5;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_230 + lVar4));
    }
    if ((long *)((long)local_248 + lVar4) != *(long **)((long)local_258 + lVar4)) {
      alStack_2a0[2] = 0xde8d01;
      operator_delete(*(long **)((long)local_258 + lVar4),*(long *)((long)local_248 + lVar4) + 1);
    }
    alStack_2a0[2] = 0xde8d15;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&uStack_260 + lVar4)]._M_data)
              (&local_281,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_280 + lVar4));
    plVar3 = (long *)((long)alStack_2a0 + lVar4 + 0x10);
    *(undefined1 *)((long)&uStack_260 + lVar4) = 0xff;
    if (plVar3 != *(long **)((long)alStack_2a0 + lVar4)) {
      alStack_2a0[2] = 0xde8d35;
      operator_delete(*(long **)((long)alStack_2a0 + lVar4),*plVar3 + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if (local_278 != &local_268) {
    alStack_2a0[2] = 0xde8d5a;
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  if (local_258[0] != local_248) {
    alStack_2a0[2] = 0xde8d76;
    operator_delete(local_258[0],CONCAT71(local_248[0]._1_7_,(undefined1)local_248[0]) + 1);
  }
  alStack_2a0[2] = 0xde8d82;
  bVar2 = ShouldSplit(this->descriptor_,&this->options_);
  auVar1 = local_280;
  if (bVar2) {
    plVar3 = (long *)(local_230 + 8);
    alStack_2a0[2] = 0xde8db1;
    local_238 = plVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"copy_split_fields","");
    local_1e8 = &local_1d8;
    if (local_238 == plVar3) {
      uStack_1d0 = local_230._16_8_;
    }
    else {
      local_1e8 = local_238;
    }
    local_1d8 = CONCAT71(local_230._9_7_,local_230[8]);
    local_1e0 = local_230._0_8_;
    local_230._0_8_ = 0;
    local_230[8] = 0;
    alStack_2a0[2] = 0xde8e14;
    local_238 = plVar3;
    local_1c8._0_8_ = operator_new(0x38);
    *(pointer **)local_1c8._0_8_ = &local_210;
    *(pointer **)(local_1c8._0_8_ + 8) = &local_218;
    *(MessageGenerator **)(local_1c8._0_8_ + 0x10) = this;
    *(undefined1 **)(local_1c8._0_8_ + 0x18) = local_280;
    *(undefined8 ***)(local_1c8._0_8_ + 0x20) = &local_208;
    *(undefined8 **)(local_1c8._0_8_ + 0x28) = &local_1f8;
    *(undefined1 *)(local_1c8._0_8_ + 0x30) = 0;
    local_1b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_1c8._8_8_ = 0;
    local_1c8._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_1a8 = 1;
    local_198 = 0;
    local_190 = 0;
    local_180 = 0;
    alStack_2a0[2] = 0xde8eaf;
    local_1a0 = &local_190;
    std::__cxx11::string::_M_replace((ulong)&local_1a0,0,(char *)0x0,0x1258832);
    local_178._M_engaged = false;
    alStack_2a0[2] = 0xde8ed7;
    io::Printer::Emit((Printer *)auVar1,&local_1e8,1,0xb8,
                      "\n              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n                PrepareSplitMessageForWrite();\n                $copy_split_fields$;\n              }\n            "
                     );
    if (local_178._M_engaged == true) {
      alStack_2a0[2] = 0xde8eee;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_178);
    }
    if (local_1a0 != &local_190) {
      alStack_2a0[2] = 0xde8f0f;
      operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
    }
    alStack_2a0[2] = 0xde8f24;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_1a8]._M_data)
              (&local_281,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_1c8);
    local_1a8 = 0xff;
    if (local_1e8 != &local_1d8) {
      alStack_2a0[2] = 0xde8f51;
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_238 != plVar3) {
      alStack_2a0[2] = 0xde8f68;
      operator_delete(local_238,CONCAT71(local_230._9_7_,local_230[8]) + 1);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCopyInitFields(io::Printer* p) const {
  auto begin = optimized_order_.begin();
  auto end = optimized_order_.end();
  const FieldDescriptor* first = nullptr;

  auto emit_pending_copy_fields = [&](decltype(end) itend, bool split) {
    if (first != nullptr) {
      const FieldDescriptor* last = itend[-1];
      if (first != last) {
        p->Emit({{"first", FieldName(first)},
                 {"last", FieldName(last)},
                 {"Impl", split ? "Impl_::Split" : "Impl_"},
                 {"pdst", split ? "_impl_._split_" : "&_impl_"},
                 {"psrc", split ? "from._impl_._split_" : "&from._impl_"}},
                R"cc(
                  ::memcpy(reinterpret_cast<char *>($pdst$) +
                               offsetof($Impl$, $first$_),
                           reinterpret_cast<const char *>($psrc$) +
                               offsetof($Impl$, $first$_),
                           offsetof($Impl$, $last$_) -
                               offsetof($Impl$, $first$_) +
                               sizeof($Impl$::$last$_));
                )cc");
      } else {
        p->Emit({{"field", FieldMemberName(first, split)}},
                R"cc(
                  $field$ = from.$field$;
                )cc");
      }
      first = nullptr;
    }
  };

  int has_bit_word_index = -1;
  auto load_has_bits = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) return;
    int has_bit_index = has_bit_indices_[field->index()];
    if (has_bit_word_index != has_bit_index / 32) {
      p->Emit({{"declare", has_bit_word_index < 0 ? "::uint32_t " : ""},
               {"index", has_bit_index / 32}},
              "$declare$cached_has_bits = _impl_._has_bits_[$index$];\n");
      has_bit_word_index = has_bit_index / 32;
    }
  };

  auto has_message = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) {
      p->Emit("from.$field$ != nullptr");
    } else {
      int has_bit_index = has_bit_indices_[field->index()];
      p->Emit({{"condition", GenerateConditionMaybeWithProbabilityForField(
                                 has_bit_index, field, options_)}},
              "$condition$");
    }
  };

  auto emit_copy_message = [&](const FieldDescriptor* field) {
    load_has_bits(field);
    p->Emit({{"has_msg", [&] { has_message(field); }},
             {"submsg", FieldMessageTypeName(field, options_)}},
            R"cc(
              $field$ = ($has_msg$)
                            ? $superclass$::CopyConstruct(arena, *from.$field$)
                            : nullptr;
            )cc");
  };

  auto generate_copy_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      // Non trivial field values are copy constructed
      if (!gen.has_trivial_value() || gen.should_split()) {
        emit_pending_copy_fields(it, false);
        continue;
      }

      if (gen.is_message()) {
        emit_pending_copy_fields(it, false);
        emit_copy_message(*it);
      } else if (first == nullptr) {
        first = *it;
      }
    }
    emit_pending_copy_fields(end, false);
  };

  auto generate_copy_split_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      if (!gen.should_split()) {
        emit_pending_copy_fields(it, true);
        continue;
      }

      if (gen.is_trivial()) {
        if (first == nullptr) first = *it;
      } else {
        emit_pending_copy_fields(it, true);
        gen.GenerateCopyConstructorCode(p);
      }
    }
    emit_pending_copy_fields(end, true);
  };

  auto generate_copy_oneof_fields = [&]() {
    for (const auto* oneof : OneOfRange(descriptor_)) {
      p->Emit(
          {{"name", oneof->name()},
           {"NAME", absl::AsciiStrToUpper(oneof->name())},
           {"cases",
            [&] {
              for (const auto* field : FieldRange(oneof)) {
                p->Emit(
                    {{"Name", UnderscoresToCamelCase(field->name(), true)},
                     {"field", FieldMemberName(field, /*split=*/false)},
                     {"body",
                      [&] {
                        field_generators_.get(field).GenerateOneofCopyConstruct(
                            p);
                      }}},
                    R"cc(
                      case k$Name$:
                        $body$;
                        break;
                    )cc");
              }
            }}},
          R"cc(
            switch ($name$_case()) {
              case $NAME$_NOT_SET:
                break;
                $cases$;
            }
          )cc");
    }
  };

  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);
    )cc");
  }

  p->Emit({{"copy_fields", generate_copy_fields},
           {"copy_oneof_fields", generate_copy_oneof_fields}},
          R"cc(
            $copy_fields$;
            $copy_oneof_fields$;
          )cc");

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"copy_split_fields", generate_copy_split_fields}},
            R"cc(
              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {
                PrepareSplitMessageForWrite();
                $copy_split_fields$;
              }
            )cc");
  }
}